

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int lws_serve_http_file_fragment(lws *wsi)

{
  lws_filepos_t *plVar1;
  char cVar2;
  lws_context *plVar3;
  ulong uVar4;
  uchar *puVar5;
  _func_int_lws_ptr_char_int *p_Var6;
  lws_fop_fd_t plVar7;
  lws_plat_file_ops *plVar8;
  lws_callback_function *callback_function;
  uint8_t *puVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  lws_fileofs_t lVar14;
  ulong uVar15;
  uint8_t *buf;
  lws_filepos_t lVar16;
  lws_filepos_t amount;
  lws_process_html_args args;
  int local_60;
  undefined4 uStack_5c;
  lws_context *local_58;
  uint8_t *local_50;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  uchar **local_38;
  
  plVar3 = wsi->context;
  cVar2 = wsi->tsi;
  _lws_log(0x10,"wsi->mux_substream %d\n",(ulong)(*(uint *)&wsi->field_0x2dc >> 1 & 1));
  local_38 = &plVar3->pt[cVar2].serv_buf;
  local_58 = plVar3;
  do {
    if (wsi->buflist_out != (lws_buflist *)0x0) {
      iVar10 = lws_issue_raw(wsi,(uchar *)0x0,0);
      if (iVar10 < 0) {
        _lws_log(8,"%s: closing\n","lws_serve_http_file_fragment");
        goto LAB_001373cb;
      }
      break;
    }
    if ((wsi->http).filepos != (wsi->http).filelen) {
      uVar13 = (ulong)(local_58->pt_serv_buf_size - 9);
      if (((wsi->http).tx_content_length != 0) &&
         (uVar4 = (wsi->http).tx_content_remain, uVar4 < uVar13)) {
        uVar13 = uVar4;
      }
      puVar5 = *local_38;
      uVar4 = wsi->protocol->tx_packet_size;
      uVar15 = uVar4;
      if (uVar13 < uVar4) {
        uVar15 = uVar13;
      }
      if (uVar4 == 0) {
        uVar15 = uVar13;
      }
      p_Var6 = wsi->role_ops->tx_credit;
      if (p_Var6 != (_func_int_lws_ptr_char_int *)0x0) {
        iVar10 = (*p_Var6)(wsi,'\0',0);
        if (iVar10 == 0) {
          _lws_log(4,"%s: %p: no tx credit\n","lws_serve_http_file_fragment",wsi);
        }
        else if ((ulong)(long)iVar10 <= uVar15) {
          uVar15 = (long)iVar10;
        }
        if (iVar10 == 0) {
          return 0;
        }
      }
      buf = puVar5 + 9;
      lVar16 = uVar15 - 0x8a;
      puVar9 = puVar5 + 0x13;
      if ((*(uint *)&wsi->field_0x2dc >> 0x14 & 1) == 0) {
        lVar16 = uVar15;
        puVar9 = buf;
      }
      plVar7 = (wsi->http).fop_fd;
      iVar11 = (*plVar7->fops->read)(plVar7,(lws_filepos_t *)&local_60,puVar9,lVar16);
      iVar10 = local_60;
      if (iVar11 < 0) goto LAB_001373cb;
      iVar11 = (int)puVar9 - (int)buf;
      if ((*(uint *)&wsi->field_0x2dc >> 0x14 & 1) != 0) {
        iVar11 = 0;
      }
      _lws_log(0x10,"%s: sending %d\n","lws_serve_http_file_fragment",
               (ulong)(uint)(iVar11 + local_60));
      iVar11 = iVar11 + iVar10;
      if (iVar11 != 0) {
        lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_CONTENT,local_58->timeout_secs);
        uVar12 = (uint)*(undefined8 *)&wsi->field_0x2dc;
        if ((uVar12 >> 0x15 & 1) != 0) {
          local_44 = (int)lVar16 + 0x80;
          local_40 = (uint)((long)iVar11 + (wsi->http).filepos == (wsi->http).filelen);
          local_3c = uVar12 >> 0x14 & 1;
          local_50 = puVar9;
          local_48 = iVar11;
          iVar10 = user_callback_handle_rxflow
                             (wsi->vhost->protocols[wsi->protocol_interpret_idx].callback,wsi,
                              LWS_CALLBACK_PROCESS_HTML,wsi->user_space,&local_50,0);
          buf = local_50;
          iVar11 = local_48;
          if (iVar10 < 0) goto LAB_001373cb;
        }
        iVar10 = lws_write(wsi,buf,(long)iVar11,
                           (uint)(CONCAT44(uStack_5c,local_60) + (wsi->http).filepos ==
                                 (wsi->http).filelen) * 4 + LWS_WRITE_HTTP);
        if (iVar10 < 0) {
LAB_001373cb:
          plVar7 = (wsi->http).fop_fd;
          if (plVar7 == (lws_fop_fd_t)0x0) {
            return -1;
          }
          plVar8 = plVar7->fops;
          if (plVar8 != (lws_plat_file_ops *)0x0) {
            (*plVar8->close)(&(wsi->http).fop_fd);
            return -1;
          }
          return -1;
        }
        plVar1 = &(wsi->http).filepos;
        *plVar1 = *plVar1 + CONCAT44(uStack_5c,local_60);
        if ((iVar10 - iVar11 != 0) &&
           (plVar7 = (wsi->http).fop_fd,
           lVar14 = (*plVar7->fops->seek_cur)(plVar7,(long)(iVar10 - iVar11)), lVar14 == -1))
        goto LAB_001373cb;
      }
    }
    if ((wsi->buflist_out == (lws_buflist *)0x0) && ((wsi->http).filelen <= (wsi->http).filepos)) {
      lwsi_set_state(wsi,0x119);
      plVar7 = (wsi->http).fop_fd;
      if ((plVar7 != (lws_fop_fd_t)0x0) &&
         (plVar8 = plVar7->fops, plVar8 != (lws_plat_file_ops *)0x0)) {
        (*plVar8->close)(&(wsi->http).fop_fd);
      }
      _lws_log(0x10,"file completed\n");
      callback_function = wsi->protocol->callback;
      if (callback_function != (lws_callback_function *)0x0) {
        iVar10 = user_callback_handle_rxflow
                           (callback_function,wsi,LWS_CALLBACK_HTTP_FILE_COMPLETION,wsi->user_space,
                            (void *)0x0,0);
        if (iVar10 < 0) {
          return -(uint)((wsi->field_0x2dc & 2) == 0) | 1;
        }
        return 1;
      }
      return 1;
    }
    iVar10 = lws_send_pipe_choked(wsi);
  } while (iVar10 == 0);
  lws_callback_on_writable(wsi);
  return 0;
}

Assistant:

int lws_serve_http_file_fragment(struct lws *wsi)
{
	struct lws_context *context = wsi->context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	struct lws_process_html_args args;
	lws_filepos_t amount, poss;
	unsigned char *p, *pstart;
#if defined(LWS_WITH_RANGES)
	unsigned char finished = 0;
#endif
	int n, m;

	lwsl_debug("wsi->mux_substream %d\n", wsi->mux_substream);

	do {

		/* priority 1: buffered output */

		if (lws_has_buffered_out(wsi)) {
			if (lws_issue_raw(wsi, NULL, 0) < 0) {
				lwsl_info("%s: closing\n", __func__);
				goto file_had_it;
			}
			break;
		}

		/* priority 2: buffered pre-compression-transform */

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
	if (wsi->http.comp_ctx.buflist_comp ||
	    wsi->http.comp_ctx.may_have_more) {
		enum lws_write_protocol wp = LWS_WRITE_HTTP;

		lwsl_info("%s: completing comp partial (buflist %p, may %d)\n",
			   __func__, wsi->http.comp_ctx.buflist_comp,
			   wsi->http.comp_ctx.may_have_more);

		if (wsi->role_ops->write_role_protocol(wsi, NULL, 0, &wp) < 0) {
			lwsl_info("%s signalling to close\n", __func__);
			goto file_had_it;
		}
		lws_callback_on_writable(wsi);

		break;
	}
#endif

		if (wsi->http.filepos == wsi->http.filelen)
			goto all_sent;

		n = 0;
		p = pstart = pt->serv_buf + LWS_H2_FRAME_HEADER_LENGTH;

#if defined(LWS_WITH_RANGES)
		if (wsi->http.range.count_ranges && !wsi->http.range.inside) {

			lwsl_notice("%s: doing range start %llu\n", __func__,
				    wsi->http.range.start);

			if ((long long)lws_vfs_file_seek_cur(wsi->http.fop_fd,
						   wsi->http.range.start -
						   wsi->http.filepos) < 0)
				goto file_had_it;

			wsi->http.filepos = wsi->http.range.start;

			if (wsi->http.range.count_ranges > 1) {
				n =  lws_snprintf((char *)p,
						context->pt_serv_buf_size -
						LWS_H2_FRAME_HEADER_LENGTH,
					"_lws\x0d\x0a"
					"Content-Type: %s\x0d\x0a"
					"Content-Range: bytes "
						"%llu-%llu/%llu\x0d\x0a"
					"\x0d\x0a",
					wsi->http.multipart_content_type,
					wsi->http.range.start,
					wsi->http.range.end,
					wsi->http.range.extent);
				p += n;
			}

			wsi->http.range.budget = wsi->http.range.end -
						   wsi->http.range.start + 1;
			wsi->http.range.inside = 1;
		}
#endif

		poss = context->pt_serv_buf_size - n -
				LWS_H2_FRAME_HEADER_LENGTH;

		if (wsi->http.tx_content_length)
			if (poss > wsi->http.tx_content_remain)
				poss = wsi->http.tx_content_remain;

		/*
		 * If there is a hint about how much we will do well to send at
		 * one time, restrict ourselves to only trying to send that.
		 */
		if (wsi->protocol->tx_packet_size &&
		    poss > wsi->protocol->tx_packet_size)
			poss = wsi->protocol->tx_packet_size;

		if (wsi->role_ops->tx_credit) {
			lws_filepos_t txc =
				wsi->role_ops->tx_credit(wsi, LWSTXCR_US_TO_PEER, 0);

			if (!txc) {
				/*
				 * We shouldn't've been able to get the
				 * WRITEABLE if we are skint
				 */
				lwsl_notice("%s: %p: no tx credit\n", __func__,
						wsi);

				return 0;
			}
			if (txc < poss)
				poss = txc;

			/*
			 * Tracking consumption of the actual payload amount
			 * will be handled when the role data frame is sent...
			 */
		}

#if defined(LWS_WITH_RANGES)
		if (wsi->http.range.count_ranges) {
			if (wsi->http.range.count_ranges > 1)
				poss -= 7; /* allow for final boundary */
			if (poss > wsi->http.range.budget)
				poss = wsi->http.range.budget;
		}
#endif
		if (wsi->sending_chunked) {
			/* we need to drop the chunk size in here */
			p += 10;
			/* allow for the chunk to grow by 128 in translation */
			poss -= 10 + 128;
		}

		if (lws_vfs_file_read(wsi->http.fop_fd, &amount, p, poss) < 0)
			goto file_had_it; /* caller will close */

		if (wsi->sending_chunked)
			n = (int)amount;
		else
			n = lws_ptr_diff(p, pstart) + (int)amount;

		lwsl_debug("%s: sending %d\n", __func__, n);

		if (n) {
			lws_set_timeout(wsi, PENDING_TIMEOUT_HTTP_CONTENT,
					context->timeout_secs);

			if (wsi->interpreting) {
				args.p = (char *)p;
				args.len = n;
				args.max_len = (unsigned int)poss + 128;
				args.final = wsi->http.filepos + n ==
					     wsi->http.filelen;
				args.chunked = wsi->sending_chunked;
				if (user_callback_handle_rxflow(
				     wsi->vhost->protocols[
				     (int)wsi->protocol_interpret_idx].callback,
				     wsi, LWS_CALLBACK_PROCESS_HTML,
				     wsi->user_space, &args, 0) < 0)
					goto file_had_it;
				n = args.len;
				p = (unsigned char *)args.p;
			} else
				p = pstart;

#if defined(LWS_WITH_RANGES)
			if (wsi->http.range.send_ctr + 1 ==
				wsi->http.range.count_ranges && // last range
			    wsi->http.range.count_ranges > 1 && // was 2+ ranges (ie, multipart)
			    wsi->http.range.budget - amount == 0) {// final part
				n += lws_snprintf((char *)pstart + n, 6,
					"_lws\x0d\x0a"); // append trailing boundary
				lwsl_debug("added trailing boundary\n");
			}
#endif
			m = lws_write(wsi, p, n, wsi->http.filepos + amount ==
					wsi->http.filelen ?
					 LWS_WRITE_HTTP_FINAL : LWS_WRITE_HTTP);
			if (m < 0)
				goto file_had_it;

			wsi->http.filepos += amount;

#if defined(LWS_WITH_RANGES)
			if (wsi->http.range.count_ranges >= 1) {
				wsi->http.range.budget -= amount;
				if (wsi->http.range.budget == 0) {
					lwsl_notice("range budget exhausted\n");
					wsi->http.range.inside = 0;
					wsi->http.range.send_ctr++;

					if (lws_ranges_next(&wsi->http.range) < 1) {
						finished = 1;
						goto all_sent;
					}
				}
			}
#endif

			if (m != n) {
				/* adjust for what was not sent */
				if (lws_vfs_file_seek_cur(wsi->http.fop_fd,
							   m - n) ==
							     (lws_fileofs_t)-1)
					goto file_had_it;
			}
		}

all_sent:
		if ((!lws_has_buffered_out(wsi)
#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
				&& !wsi->http.comp_ctx.buflist_comp &&
		    !wsi->http.comp_ctx.may_have_more
#endif
		    ) && (wsi->http.filepos >= wsi->http.filelen
#if defined(LWS_WITH_RANGES)
		    || finished)
#else
		)
#endif
		) {
			lwsi_set_state(wsi, LRS_ESTABLISHED);
			/* we might be in keepalive, so close it off here */
			lws_vfs_file_close(&wsi->http.fop_fd);

			lwsl_debug("file completed\n");

			if (wsi->protocol->callback &&
			    user_callback_handle_rxflow(wsi->protocol->callback,
					wsi, LWS_CALLBACK_HTTP_FILE_COMPLETION,
					wsi->user_space, NULL, 0) < 0) {
					/*
					 * For http/1.x, the choices from
					 * transaction_completed are either
					 * 0 to use the connection for pipelined
					 * or nonzero to hang it up.
					 *
					 * However for http/2. while we are
					 * still interested in hanging up the
					 * nwsi if there was a network-level
					 * fatal error, simply completing the
					 * transaction is a matter of the stream
					 * state, not the root connection at the
					 * network level
					 */
					if (wsi->mux_substream)
						return 1;
					else
						return -1;
				}

			return 1;  /* >0 indicates completed */
		}
		/*
		 * while(1) here causes us to spam the whole file contents into
		 * a hugely bloated output buffer if it ever can't send the
		 * whole chunk...
		 */
	} while (!lws_send_pipe_choked(wsi));

	lws_callback_on_writable(wsi);

	return 0; /* indicates further processing must be done */

file_had_it:
	lws_vfs_file_close(&wsi->http.fop_fd);

	return -1;
}